

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O1

void TemplateCacheUnittest::TestTemplateSearchPath(void)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  int iVar6;
  Template *pTVar7;
  long lVar8;
  string *this;
  bool bVar9;
  TemplateCache cache2;
  string path_a_foo;
  string pathA;
  string pathB;
  TemplateCache cache1;
  string path_b_foo;
  string path_b_bar;
  TemplateDictionary dict;
  undefined1 local_200 [32];
  undefined1 local_1e0 [64];
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  TemplateString local_120 [2];
  string local_e0;
  string local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [96];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_120);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"a/","");
  ctemplate::PathJoin((string *)&local_160,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"b/","");
  ctemplate::PathJoin((string *)&local_140,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  ctemplate::CreateOrCleanTestDir(&local_160);
  ctemplate::CreateOrCleanTestDir(&local_140);
  local_1e0._0_8_ = "";
  local_1e0._8_8_ = 0;
  local_1e0[0x10] = true;
  local_1e0._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_a0,(TemplateString *)local_1e0,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_120);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)local_120);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  if (local_1e0._8_8_ == local_160._M_string_length) {
    if (local_1e0._8_8_ == 0) {
      bVar9 = true;
    }
    else {
      iVar6 = bcmp((void *)local_1e0._0_8_,local_160._M_dataplus._M_p,local_1e0._8_8_);
      bVar9 = iVar6 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  pcVar1 = local_1e0 + 0x10;
  if ((char *)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if (bVar9) {
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"template_bar","");
    ctemplate::PathJoin((string *)&local_c0,(string *)&local_140);
    if ((char *)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_);
    }
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"b/template_bar","");
    ctemplate::StringToFile((string *)local_1e0,&local_c0);
    if ((char *)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_);
    }
    _Var5._M_p = local_c0._M_dataplus._M_p;
    paVar3 = &local_180.field_2;
    local_180._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"template_bar","");
    ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
    uVar4 = local_1e0._0_8_;
    iVar6 = strcmp(_Var5._M_p,(char *)local_1e0._0_8_);
    if ((char *)uVar4 != pcVar1) {
      operator_delete((void *)uVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar3) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if (iVar6 == 0) {
      local_1e0._0_8_ = "template_bar";
      local_1e0._8_8_ = 0xc;
      local_1e0[0x10] = true;
      local_1e0._24_8_ = 0;
      pTVar7 = (Template *)ctemplate::TemplateCache::GetTemplate(local_120,(Strip)local_1e0);
      if (pTVar7 == (Template *)0x0) {
        printf("ASSERT FAILED, line %d: %s\n",0x118,"b_bar");
        __assert_fail("b_bar",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x118,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
      }
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"b/template_bar","");
      ctemplate::AssertExpandIs(pTVar7,(TemplateDictionary *)local_a0,(string *)local_1e0,true);
      if ((char *)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"template_foo","");
      ctemplate::PathJoin((string *)&local_180,(string *)&local_160);
      if ((char *)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"template_foo","");
      ctemplate::PathJoin((string *)&local_e0,(string *)&local_140);
      if ((char *)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"a/template_foo","");
      ctemplate::StringToFile((string *)local_1e0,&local_180);
      if ((char *)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"b/template_foo","");
      ctemplate::StringToFile((string *)local_1e0,&local_e0);
      if ((char *)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      _Var5._M_p = local_180._M_dataplus._M_p;
      local_200._0_8_ = local_200 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"template_foo","");
      ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
      uVar4 = local_1e0._0_8_;
      iVar6 = strcmp(_Var5._M_p,(char *)local_1e0._0_8_);
      if ((char *)uVar4 != pcVar1) {
        operator_delete((void *)uVar4);
      }
      pcVar2 = local_200 + 0x10;
      if ((char *)local_200._0_8_ != pcVar2) {
        operator_delete((void *)local_200._0_8_);
      }
      if (iVar6 == 0) {
        local_1e0._0_8_ = "template_foo";
        local_1e0._8_8_ = 0xc;
        local_1e0[0x10] = true;
        local_1e0._24_8_ = 0;
        pTVar7 = (Template *)ctemplate::TemplateCache::GetTemplate(local_120,(Strip)local_1e0);
        if (pTVar7 == (Template *)0x0) {
          printf("ASSERT FAILED, line %d: %s\n",0x124,"a_foo");
          __assert_fail("a_foo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x124,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
        local_1e0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"a/template_foo","");
        ctemplate::AssertExpandIs(pTVar7,(TemplateDictionary *)local_a0,(string *)local_1e0,true);
        if ((char *)local_1e0._0_8_ != pcVar1) {
          operator_delete((void *)local_1e0._0_8_);
        }
        local_200._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"baz","");
        ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
        uVar4 = local_1e0._8_8_;
        if ((char *)local_1e0._0_8_ != pcVar1) {
          operator_delete((void *)local_1e0._0_8_);
        }
        if ((char *)local_200._0_8_ != pcVar2) {
          operator_delete((void *)local_200._0_8_);
        }
        if (uVar4 != 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x129,"cache1.FindTemplateFilename(\"baz\").empty()"
                );
          local_200._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"baz","");
          ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
          if (local_1e0._8_8_ != 0) {
            __assert_fail("cache1.FindTemplateFilename(\"baz\").empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x129,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
          goto LAB_001097c4;
        }
        ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_1e0);
        ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_1e0);
        _Var5._M_p = local_e0._M_dataplus._M_p;
        paVar3 = &local_1a0.field_2;
        local_1a0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
        ctemplate::TemplateCache::FindTemplateFilename((string *)local_200);
        uVar4 = local_200._0_8_;
        iVar6 = strcmp(_Var5._M_p,(char *)local_200._0_8_);
        if ((undefined1 *)uVar4 != local_200 + 0x10) {
          operator_delete((void *)uVar4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        pcVar1 = local_200 + 0x10;
        if (iVar6 != 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x12f,
                 "strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                );
          local_1a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
          ctemplate::TemplateCache::FindTemplateFilename((string *)local_200);
          iVar6 = strcmp(local_e0._M_dataplus._M_p,(char *)local_200._0_8_);
          if (iVar6 != 0) {
            __assert_fail("strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x12f,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
LAB_00109934:
          std::__cxx11::string::~string((string *)local_200);
          this = &local_1a0;
          goto LAB_00109943;
        }
        local_200._0_8_ = "template_foo";
        local_200._8_8_ = 0xc;
        local_200[0x10] = '\x01';
        local_200._24_8_ = 0;
        pTVar7 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)local_1e0,(Strip)local_200)
        ;
        if (pTVar7 == (Template *)0x0) {
          printf("ASSERT FAILED, line %d: %s\n",0x131,"b_foo");
          __assert_fail("b_foo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x131,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
        local_200._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"b/template_foo","");
        ctemplate::AssertExpandIs(pTVar7,(TemplateDictionary *)local_a0,(string *)local_200,true);
        if ((char *)local_200._0_8_ != pcVar1) {
          operator_delete((void *)local_200._0_8_);
        }
        ctemplate::default_template_cache();
        ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
        iVar6 = std::__cxx11::string::compare(local_200);
        if ((char *)local_200._0_8_ != pcVar1) {
          operator_delete((void *)local_200._0_8_);
        }
        if (iVar6 == 0) {
          local_1a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
          ctemplate::default_template_cache();
          ctemplate::TemplateCache::FindTemplateFilename((string *)local_200);
          uVar4 = local_200._8_8_;
          if ((char *)local_200._0_8_ != pcVar1) {
            operator_delete((void *)local_200._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a0._M_dataplus._M_p);
          }
          if (uVar4 == 0) {
            local_200._0_8_ = "template_foo";
            local_200._8_8_ = 0xc;
            local_200[0x10] = '\x01';
            local_200._24_8_ = 0;
            lVar8 = ctemplate::Template::GetTemplate((TemplateString *)local_200,DO_NOT_STRIP);
            if (lVar8 == 0) {
              ctemplate::CreateOrCleanTestDir(&local_160);
              ctemplate::CreateOrCleanTestDir(&local_140);
              ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p);
              }
              ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_120);
              return;
            }
            printf("ASSERT FAILED, line %d: %s\n",0x137,
                   "!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)");
            local_200._0_8_ = "template_foo";
            local_200._8_8_ = 0xc;
            local_200[0x10] = '\x01';
            local_200._24_8_ = 0;
            lVar8 = ctemplate::Template::GetTemplate((TemplateString *)local_200,DO_NOT_STRIP);
            if (lVar8 != 0) {
              __assert_fail("!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0x137,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
            }
            goto LAB_0010998c;
          }
          printf("ASSERT FAILED, line %d: %s\n",0x136,
                 "Template::FindTemplateFilename(\"template_foo\").empty()");
          local_1a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
          ctemplate::default_template_cache();
          ctemplate::TemplateCache::FindTemplateFilename((string *)local_200);
          if (local_200._8_8_ != 0) {
            __assert_fail("Template::FindTemplateFilename(\"template_foo\").empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x136,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
          goto LAB_00109934;
        }
        printf("ASSERT FAILED, line %d: %s\n",0x135,"Template::template_root_directory() == kCWD");
        ctemplate::default_template_cache();
        ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
        iVar6 = std::__cxx11::string::compare(local_200);
        if (iVar6 != 0) {
          __assert_fail("Template::template_root_directory() == kCWD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x135,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x122,
               "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
              );
        _Var5._M_p = local_180._M_dataplus._M_p;
        local_200._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"template_foo","");
        ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
        iVar6 = strcmp(_Var5._M_p,(char *)local_1e0._0_8_);
        if (iVar6 != 0) {
          __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x122,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
LAB_001097c4:
        std::__cxx11::string::~string((string *)local_1e0);
      }
      this = (string *)local_200;
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x116,
             "strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0"
            );
      local_180._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"template_bar","");
      ctemplate::TemplateCache::FindTemplateFilename((string *)local_1e0);
      iVar6 = strcmp(local_c0._M_dataplus._M_p,(char *)local_1e0._0_8_);
      if (iVar6 != 0) {
        __assert_fail("strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x116,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
      }
      std::__cxx11::string::~string((string *)local_1e0);
      this = &local_180;
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x110,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    if (local_1e0._8_8_ != local_160._M_string_length) {
LAB_00109996:
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x110,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    if (local_1e0._8_8_ != 0) {
      iVar6 = bcmp((void *)local_1e0._0_8_,local_160._M_dataplus._M_p,local_1e0._8_8_);
      if (iVar6 != 0) goto LAB_00109996;
    }
    this = (string *)local_1e0;
  }
LAB_00109943:
  std::__cxx11::string::~string((string *)this);
LAB_0010998c:
  exit(1);
}

Assistant:

static void TestTemplateSearchPath() {
    TemplateCache cache1;

    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);

    TemplateDictionary dict("");
    cache1.SetTemplateRootDirectory(pathA);
    cache1.AddAlternateTemplateRootDirectory(pathB);
    ASSERT(cache1.template_root_directory() == pathA);

    // 1. Show that a template in the secondary path can be found.
    const string path_b_bar = PathJoin(pathB, "template_bar");
    StringToFile("b/template_bar", path_b_bar);
    ASSERT_STREQ(path_b_bar.c_str(),
                 cache1.FindTemplateFilename("template_bar").c_str());
    const Template* b_bar = cache1.GetTemplate("template_bar", DO_NOT_STRIP);
    ASSERT(b_bar);
    AssertExpandIs(b_bar, &dict, "b/template_bar", true);

    // 2. Show that the search stops once the first match is found.
    //    Create two templates in separate directories with the same name.
    const string path_a_foo = PathJoin(pathA, "template_foo");
    const string path_b_foo = PathJoin(pathB, "template_foo");
    StringToFile("a/template_foo", path_a_foo);
    StringToFile("b/template_foo", path_b_foo);
    ASSERT_STREQ(path_a_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());
    const Template* a_foo = cache1.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(a_foo);
    AssertExpandIs(a_foo, &dict, "a/template_foo", true);

    // 3. Show that attempting to find a non-existent template gives an
    //    empty path.
    ASSERT(cache1.FindTemplateFilename("baz").empty());

    // 4. If we make a new cache, its path will be followed.
    TemplateCache cache2;
    cache2.SetTemplateRootDirectory(pathB);
    ASSERT_STREQ(path_b_foo.c_str(),
                 cache2.FindTemplateFilename("template_foo").c_str());
    const Template* b_foo = cache2.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(b_foo);
    AssertExpandIs(b_foo, &dict, "b/template_foo", true);

    // 5. Neither path will work for the default cache, which has no path.
    ASSERT(Template::template_root_directory() == kCWD);
    ASSERT(Template::FindTemplateFilename("template_foo").empty());
    ASSERT(!Template::GetTemplate("template_foo", DO_NOT_STRIP));

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }